

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_linux.c
# Opt level: O0

int os_fd_linux_event_wait(os_fd_select *sel)

{
  uint64_t uVar1;
  int iVar2;
  uint64_t uVar3;
  ulong in_stack_ffffffffffffff80;
  int local_5c;
  ulong uStack_58;
  int i;
  uint64_t maxdelay;
  os_fd *sock;
  os_fd_select *sel_local;
  
  uVar1 = sel->deadline;
  uVar3 = oonf_clock_getNow();
  uStack_58 = uVar1 - uVar3;
  if (0x7fffffff < uStack_58) {
    uStack_58 = 0x7fffffff;
  }
  iVar2 = epoll_wait(sel->_epoll_fd,(epoll_event *)sel,0x10,(int)uStack_58);
  sel->_event_count = iVar2;
  if ((log_global_mask[_oonf_os_fd_subsystem.logging] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,_oonf_os_fd_subsystem.logging,"src/base/os_linux/os_fd_linux.c",0x70
             ,(void *)0x0,0,"epoll_wait(maxdelay = %lu): %d",uStack_58,sel->_event_count);
    in_stack_ffffffffffffff80 = uStack_58;
  }
  for (local_5c = 0; local_5c < sel->_event_count; local_5c = local_5c + 1) {
    uVar1 = sel->_events[local_5c].data.u64;
    *(uint32_t *)(uVar1 + 8) = sel->_events[local_5c].events;
    if ((log_global_mask[_oonf_os_fd_subsystem.logging] & 1) != 0) {
      in_stack_ffffffffffffff80 = CONCAT44((int)(in_stack_ffffffffffffff80 >> 0x20),local_5c);
      oonf_log(LOG_SEVERITY_DEBUG,_oonf_os_fd_subsystem.logging,"src/base/os_linux/os_fd_linux.c",
               0x76,(void *)0x0,0,"event %d: %x",in_stack_ffffffffffffff80,
               *(undefined4 *)(uVar1 + 8));
    }
  }
  return sel->_event_count;
}

Assistant:

int
os_fd_linux_event_wait(struct os_fd_select *sel) {
  struct os_fd *sock;
  uint64_t maxdelay;
  int i;

  maxdelay = oonf_clock_get_relative(sel->deadline);
  if (maxdelay > INT32_MAX) {
    maxdelay = INT32_MAX;
  }

  sel->_event_count = epoll_wait(sel->_epoll_fd, sel->_events, ARRAYSIZE(sel->_events), maxdelay);

  OONF_DEBUG(LOG_OS_SOCKET, "epoll_wait(maxdelay = %" PRIu64 "): %d", maxdelay, sel->_event_count);

  for (i = 0; i < sel->_event_count; i++) {
    sock = os_fd_event_get(sel, i);
    sock->received_events = sel->_events[i].events;

    OONF_DEBUG(LOG_OS_SOCKET, "event %d: %x", i, sock->received_events);
  }
  return sel->_event_count;
}